

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::DefaultsTest::testBuffersDimensions
          (DefaultsTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  MessageBuilder local_650;
  MessageBuilder local_4d0;
  GLint64 local_350;
  GLint64 buffer_size;
  undefined1 local_340 [4];
  GLint i_1;
  MessageBuilder local_1b0;
  GLint64 local_30;
  GLint64 buffer_start;
  long lStack_20;
  GLint i;
  Functions *gl;
  DefaultsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  buffer_start._4_4_ = 0;
  while( true ) {
    if (this->m_xfb_indexed_binding_points_count <= (int)buffer_start._4_4_) {
      buffer_size._4_4_ = 0;
      while( true ) {
        if (this->m_xfb_indexed_binding_points_count <= (int)buffer_size._4_4_) {
          return true;
        }
        local_350 = -1;
        (*this->m_gl_getTransformFeedbacki64_v)(this->m_xfb_dsa,0x8c85,buffer_size._4_4_,&local_350)
        ;
        dVar2 = (**(code **)(lStack_20 + 0x800))();
        glu::checkError(dVar2,"glGetTransformFeedbacki_v have failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                        ,0x1a2);
        if (local_350 == -1) break;
        if (local_350 != 0) {
          pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar5 = tcu::TestContext::getLog(pTVar4);
          tcu::TestLog::operator<<(&local_650,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_650,
                              (char (*) [89])
                              "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_SIZE has returned "
                             );
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_350);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [25])", however 0 is expected.")
          ;
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_650);
          return false;
        }
        buffer_size._4_4_ = buffer_size._4_4_ + 1;
      }
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_4d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_4d0,
                          (char (*) [135])
                          "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_SIZE has not returned anything and error has not been generated."
                         );
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4d0);
      return false;
    }
    local_30 = -1;
    (*this->m_gl_getTransformFeedbacki64_v)(this->m_xfb_dsa,0x8c84,buffer_start._4_4_,&local_30);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glGetTransformFeedbacki_v have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x17f);
    if (local_30 == -1) {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_1b0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_1b0,
                          (char (*) [136])
                          "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_START has not returned anything and error has not been generated."
                         );
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      return false;
    }
    if (local_30 != 0) break;
    buffer_start._4_4_ = buffer_start._4_4_ + 1;
  }
  pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_340,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_340,
                      (char (*) [90])
                      "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_START has returned "
                     );
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_30);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [25])", however 0 is expected.");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_340);
  return false;
}

Assistant:

bool DefaultsTest::testBuffersDimensions()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check default buffers' start value. */
	for (glw::GLint i = 0; i < m_xfb_indexed_binding_points_count; ++i)
	{
		glw::GLint64 buffer_start = -1;

		m_gl_getTransformFeedbacki64_v(m_xfb_dsa, GL_TRANSFORM_FEEDBACK_BUFFER_START, i, &buffer_start);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbacki_v have failed");

		if (-1 == buffer_start)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_START has not returned "
				   "anything and error has not been generated."
				<< tcu::TestLog::EndMessage;

			return false;
		}
		else
		{
			if (0 != buffer_start)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_START has returned "
					<< buffer_start << ", however 0 is expected." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	/** @brief Check default buffers' size value.
	 *
	 *  @note The function may throw if unexpected error has occured.
	 */
	for (glw::GLint i = 0; i < m_xfb_indexed_binding_points_count; ++i)
	{
		glw::GLint64 buffer_size = -1;

		m_gl_getTransformFeedbacki64_v(m_xfb_dsa, GL_TRANSFORM_FEEDBACK_BUFFER_SIZE, i, &buffer_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbacki_v have failed");

		if (-1 == buffer_size)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_SIZE has not returned "
				   "anything and error has not been generated."
				<< tcu::TestLog::EndMessage;

			return false;
		}
		else
		{
			if (0 != buffer_size)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glGetTransformFeedbacki_v with parameter GL_TRANSFORM_FEEDBACK_BUFFER_SIZE has returned "
					<< buffer_size << ", however 0 is expected." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}